

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

void * nullcGetVariableData(uint *count)

{
  uint *count_local;
  
  if (NULLC::currExec == 1) {
    count_local = (uint *)ExecutorX86::GetVariableData(NULLC::executorX86,count);
  }
  else if (NULLC::currExec == 0) {
    count_local = (uint *)ExecutorRegVm::GetVariableData(NULLC::executorRegVm,count);
  }
  else {
    count_local = (uint *)0x0;
  }
  return count_local;
}

Assistant:

void* nullcGetVariableData(unsigned int *count)
{
	using namespace NULLC;

	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		return executorX86->GetVariableData(count);
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	}
	else if(currExec == NULLC_LLVM)
	{
		return executorLLVM->GetVariableData(count);
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
#ifndef NULLC_NO_EXECUTOR
		return executorRegVm->GetVariableData(count);
#endif
	}

	(void)count;
	return NULL;
}